

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFDebugLoc.cpp
# Opt level: O2

void __thiscall
llvm::DWARFDebugLoclists::Entry::dump
          (Entry *this,raw_ostream *OS,uint64_t *BaseAddr,bool IsLittleEndian,uint AddressSize,
          MCRegisterInfo *MRI,DWARFUnit *U,DIDumpOptions DumpOpts,uint Indent,
          size_t MaxEncodingStringLength)

{
  byte bVar1;
  undefined8 uVar2;
  undefined4 uVar3;
  DIDumpOptions DumpOpts_00;
  SmallVectorImpl<unsigned_char> *pSVar4;
  bool bVar5;
  undefined4 uVar6;
  uint NumSpaces;
  size_t sVar7;
  raw_ostream *prVar8;
  char *Str;
  bool bVar9;
  undefined1 auVar10 [16];
  ArrayRef<unsigned_char> Data;
  StringRef SVar11;
  DWARFAddressRange local_98;
  undefined1 local_80 [8];
  anon_class_32_4_29a496e3 PrintPrefix;
  
  sVar7 = MaxEncodingStringLength;
  NumSpaces = Indent;
  uVar6 = DumpOpts._20_4_;
  bVar5 = DumpOpts.Verbose;
  bVar9 = DumpOpts.Verbose == true;
  DumpOpts._20_4_ = uVar6;
  if (bVar9) {
    raw_ostream::operator<<(OS,"\n");
    raw_ostream::indent(OS,NumSpaces);
    SVar11 = dwarf::LocListEncodingString((uint)this->Kind);
    PrintPrefix.MaxEncodingStringLength = (size_t *)SVar11.Data;
    if (SVar11.Length == 0) {
      __assert_fail("!EncodingString.empty() && \"Unknown loclist entry encoding\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/third_party/llvm-project/DWARFDebugLoc.cpp"
                    ,0xf2,
                    "void llvm::DWARFDebugLoclists::Entry::dump(raw_ostream &, uint64_t &, bool, unsigned int, const MCRegisterInfo *, DWARFUnit *, DIDumpOptions, unsigned int, size_t) const"
                   );
    }
    PrintPrefix.DumpOpts = (DIDumpOptions *)((sVar7 - SVar11.Length) + 1);
    PrintPrefix.OS = (raw_ostream *)0xc09706;
    local_80 = (undefined1  [8])&PTR_home_00e22e40;
    PrintPrefix.Indent = (uint *)CONCAT71(PrintPrefix.Indent._1_7_,0x28);
    raw_ostream::operator<<(OS,(format_object_base *)local_80);
    bVar1 = this->Kind;
    if (bVar1 < 9) {
      if ((0x118U >> (bVar1 & 0x1f) & 1) == 0) {
        if ((0x42U >> (bVar1 & 0x1f) & 1) == 0) goto LAB_00b383d8;
        PrintPrefix.OS = (raw_ostream *)0xc08c66;
        local_80 = (undefined1  [8])&PTR_home_00e22858;
        PrintPrefix.Indent = (uint *)this->Value0;
        PrintPrefix.DumpOpts = (DIDumpOptions *)CONCAT44(AddressSize * 2,AddressSize * 2);
      }
      else {
        PrintPrefix.OS = (raw_ostream *)anon_var_dwarf_2db24e4;
        local_80 = (undefined1  [8])&PTR_home_00e22e60;
        PrintPrefix.Indent = (uint *)this->Value1;
        PrintPrefix.DumpOpts = (DIDumpOptions *)CONCAT44(AddressSize * 2,AddressSize * 2);
        PrintPrefix.MaxEncodingStringLength = (size_t *)this->Value0;
      }
      raw_ostream::operator<<(OS,(format_object_base *)local_80);
    }
LAB_00b383d8:
    raw_ostream::operator<<(OS,')');
  }
  PrintPrefix.Indent = &DumpOpts.DumpType;
  PrintPrefix.OS = (raw_ostream *)&Indent;
  PrintPrefix.DumpOpts = (DIDumpOptions *)&MaxEncodingStringLength;
  local_80 = (undefined1  [8])OS;
  switch(this->Kind) {
  case '\0':
  case '\x01':
    break;
  default:
    llvm_unreachable_internal
              ("unreachable locations list kind",
               "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/third_party/llvm-project/DWARFDebugLoc.cpp"
               ,300);
  case '\x03':
    dump::anon_class_32_4_29a496e3::operator()((anon_class_32_4_29a496e3 *)local_80);
    prVar8 = raw_ostream::operator<<(OS,"Addr idx ");
    prVar8 = raw_ostream::operator<<(prVar8,this->Value0);
    prVar8 = raw_ostream::operator<<(prVar8," (w/ length ");
    prVar8 = raw_ostream::operator<<(prVar8,this->Value1);
    Str = "): ";
    goto LAB_00b384fe;
  case '\x04':
    dump::anon_class_32_4_29a496e3::operator()((anon_class_32_4_29a496e3 *)local_80);
    local_98.LowPC = *BaseAddr;
    auVar10._8_4_ = (int)local_98.LowPC;
    auVar10._0_8_ = local_98.LowPC;
    auVar10._12_4_ = (int)(local_98.LowPC >> 0x20);
    local_98.LowPC = local_98.LowPC + this->Value0;
    local_98.HighPC = auVar10._8_8_ + this->Value1;
    goto LAB_00b384d2;
  case '\x06':
    *BaseAddr = this->Value0;
    break;
  case '\b':
    dump::anon_class_32_4_29a496e3::operator()((anon_class_32_4_29a496e3 *)local_80);
    local_98.LowPC = this->Value0;
    local_98.HighPC = this->Value1 + local_98.LowPC;
LAB_00b384d2:
    local_98.SectionIndex = 0;
    DumpOpts_00.Verbose = DumpOpts.Verbose;
    DumpOpts_00.DisplayRawContents = DumpOpts.DisplayRawContents;
    DumpOpts_00._22_2_ = DumpOpts._22_2_;
    DumpOpts_00.ShowChildren = DumpOpts.ShowChildren;
    DumpOpts_00.ShowParents = DumpOpts.ShowParents;
    DumpOpts_00.ShowForm = DumpOpts.ShowForm;
    DumpOpts_00.SummarizeTypes = DumpOpts.SummarizeTypes;
    DumpOpts_00.ParentRecurseDepth = DumpOpts.ParentRecurseDepth;
    DumpOpts_00.Version = DumpOpts.Version;
    DumpOpts_00.AddrSize = DumpOpts.AddrSize;
    DumpOpts_00.ShowAddresses = DumpOpts.ShowAddresses;
    DumpOpts_00.DumpType = DumpOpts.DumpType;
    DumpOpts_00.ChildRecurseDepth = DumpOpts.ChildRecurseDepth;
    DWARFAddressRange::dump(&local_98,OS,AddressSize,DumpOpts_00);
    Str = ": ";
    prVar8 = OS;
LAB_00b384fe:
    raw_ostream::operator<<(prVar8,Str);
    goto LAB_00b38503;
  }
  if (bVar5 != false) {
LAB_00b38503:
    pSVar4 = &(this->Loc).super_SmallVectorImpl<unsigned_char>;
    uVar2 = (pSVar4->super_SmallVectorTemplateBase<unsigned_char,_true>).
            super_SmallVectorTemplateCommon<unsigned_char,_void>.super_SmallVectorBase.BeginX;
    uVar3 = (pSVar4->super_SmallVectorTemplateBase<unsigned_char,_true>).
            super_SmallVectorTemplateCommon<unsigned_char,_void>.super_SmallVectorBase.Size;
    Data.Length._0_4_ = uVar3;
    Data.Data = (uchar *)uVar2;
    Data.Length._4_4_ = 0;
    dumpExpression(OS,Data,IsLittleEndian,AddressSize,MRI,U);
  }
  return;
}

Assistant:

void DWARFDebugLoclists::Entry::dump(raw_ostream &OS, uint64_t &BaseAddr,
                                     bool IsLittleEndian, unsigned AddressSize,
                                     const MCRegisterInfo *MRI, DWARFUnit *U,
                                     DIDumpOptions DumpOpts, unsigned Indent,
                                     size_t MaxEncodingStringLength) const {
  if (DumpOpts.Verbose) {
    OS << "\n";
    OS.indent(Indent);
    auto EncodingString = dwarf::LocListEncodingString(Kind);
    // Unsupported encodings should have been reported during parsing.
    assert(!EncodingString.empty() && "Unknown loclist entry encoding");
    OS << format("%s%*c", EncodingString.data(),
                 MaxEncodingStringLength - EncodingString.size() + 1, '(');
    switch (Kind) {
    case dwarf::DW_LLE_startx_length:
    case dwarf::DW_LLE_start_length:
    case dwarf::DW_LLE_offset_pair:
      OS << format("0x%*.*" PRIx64 ", 0x%*.*" PRIx64, AddressSize * 2,
                 AddressSize * 2, Value0, AddressSize * 2, AddressSize * 2,
                 Value1);
      break;
    case dwarf::DW_LLE_base_addressx:
    case dwarf::DW_LLE_base_address:
      OS << format("0x%*.*" PRIx64, AddressSize * 2, AddressSize * 2,
                   Value0);
      break;
    case dwarf::DW_LLE_end_of_list:
      break;
    }
    OS << ')';
  }
  auto PrintPrefix = [&] {
    OS << "\n";
    OS.indent(Indent);
    if (DumpOpts.Verbose)
      OS << format("%*s", MaxEncodingStringLength, (const char *)"=> ");
  };
  switch (Kind) {
  case dwarf::DW_LLE_startx_length:
    PrintPrefix();
    OS << "Addr idx " << Value0 << " (w/ length " << Value1 << "): ";
    break;
  case dwarf::DW_LLE_start_length:
    PrintPrefix();
    DWARFAddressRange(Value0, Value0 + Value1)
        .dump(OS, AddressSize, DumpOpts);
    OS << ": ";
    break;
  case dwarf::DW_LLE_offset_pair:
    PrintPrefix();
    DWARFAddressRange(BaseAddr + Value0, BaseAddr + Value1)
        .dump(OS, AddressSize, DumpOpts);
    OS << ": ";
    break;
  case dwarf::DW_LLE_base_addressx:
    if (!DumpOpts.Verbose)
      return;
    break;
  case dwarf::DW_LLE_end_of_list:
    if (!DumpOpts.Verbose)
      return;
    break;
  case dwarf::DW_LLE_base_address:
    BaseAddr = Value0;
    if (!DumpOpts.Verbose)
      return;
    break;
  default:
    llvm_unreachable("unreachable locations list kind");
  }

  dumpExpression(OS, Loc, IsLittleEndian, AddressSize, MRI, U);
}